

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegReaderIncrRead(Fts3SegReader *pReader)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  int n;
  
  iVar3 = pReader->nPopulate;
  n = pReader->nNode - iVar3;
  if (0xfff < n) {
    n = 0x1000;
  }
  iVar3 = blobReadWrite(pReader->pBlob,pReader->aNode + iVar3,n,iVar3,sqlite3BtreePayloadChecked);
  if (iVar3 == 0) {
    lVar4 = (long)n + (long)pReader->nPopulate;
    pReader->nPopulate = (int)lVar4;
    pcVar2 = pReader->aNode;
    pcVar1 = pcVar2 + lVar4;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    pcVar2 = pcVar2 + lVar4 + 0x10;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    if (pReader->nPopulate == pReader->nNode) {
      sqlite3_blob_close(pReader->pBlob);
      pReader->pBlob = (sqlite3_blob *)0x0;
      pReader->nPopulate = 0;
    }
  }
  return iVar3;
}

Assistant:

static int fts3SegReaderIncrRead(Fts3SegReader *pReader){
  int nRead;                      /* Number of bytes to read */
  int rc;                         /* Return code */

  nRead = MIN(pReader->nNode - pReader->nPopulate, FTS3_NODE_CHUNKSIZE);
  rc = sqlite3_blob_read(
      pReader->pBlob, 
      &pReader->aNode[pReader->nPopulate],
      nRead,
      pReader->nPopulate
  );

  if( rc==SQLITE_OK ){
    pReader->nPopulate += nRead;
    memset(&pReader->aNode[pReader->nPopulate], 0, FTS3_NODE_PADDING);
    if( pReader->nPopulate==pReader->nNode ){
      sqlite3_blob_close(pReader->pBlob);
      pReader->pBlob = 0;
      pReader->nPopulate = 0;
    }
  }
  return rc;
}